

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O2

void google::protobuf::json_internal::ParseProto3Type::SetDouble(Field f,Msg *msg,double x)

{
  RecordAsSeen(f,msg);
  io::CodedOutputStream::WriteVarint32(&msg->stream_,(f->raw_->field_0)._impl_.number_ * 8 + 1);
  io::CodedOutputStream::WriteLittleEndian64(&msg->stream_,(uint64_t)x);
  return;
}

Assistant:

static void SetDouble(Field f, Msg& msg, double x) {
    RecordAsSeen(f, msg);
    msg.stream_.WriteTag(f->proto().number() << 3 |
                         WireFormatLite::WIRETYPE_FIXED64);
    msg.stream_.WriteLittleEndian64(absl::bit_cast<uint64_t>(x));
  }